

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

void __thiscall Thread::start(Thread *this)

{
  int iVar1;
  _Any_data *this_00;
  void *__stat_loc;
  
  if (this->started_ == true) {
    __assert_fail("!started_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/Thread.cpp"
                  ,0x53,"void Thread::start()");
  }
  this->started_ = true;
  this_00 = (_Any_data *)operator_new(0x50);
  ThreadData::ThreadData((ThreadData *)this_00,&this->func_,&this->name_,&this->tid_,&this->latch_);
  __stat_loc = (void *)0x0;
  iVar1 = pthread_create(&this->pthreadId_,(pthread_attr_t *)0x0,startThread,this_00);
  if (iVar1 != 0) {
    this->started_ = false;
    if (*(char **)(this_00->_M_pod_data + 0x20) != this_00->_M_pod_data + 0x30) {
      operator_delete(*(char **)(this_00->_M_pod_data + 0x20),
                      *(long *)(this_00->_M_pod_data + 0x30) + 1);
    }
    if (*(code **)(this_00 + 1) != (code *)0x0) {
      (**(code **)(this_00 + 1))(this_00,this_00,__destroy_functor);
    }
    operator_delete(this_00,0x50);
    return;
  }
  CountDownLatch::wait(&this->latch_,__stat_loc);
  if (0 < this->tid_) {
    return;
  }
  __assert_fail("tid_>0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/Thread.cpp"
                ,0x5b,"void Thread::start()");
}

Assistant:

void Thread::start(){
    assert(!started_);
    started_=true;
    ThreadData* data=new ThreadData(func_,name_,&tid_,&latch_);
    if(pthread_create(&pthreadId_, nullptr, &startThread, data)){
        started_=false;
        delete data;
    }else {
        latch_.wait();
        assert(tid_>0);
    }
}